

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O1

void __thiscall
nvim::NvimRPC::async_call<long,long,std::__cxx11::string,long,long,long>
          (NvimRPC *this,string *method,long *u,long *u_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_2,long *u_3,long *u_4
          ,long *u_5)

{
  ulong uVar1;
  uint16_t val;
  uint uVar2;
  long *plVar3;
  size_t __n;
  Packer pk;
  sbuffer sbuf;
  packer<msgpack::v1::sbuffer> local_68;
  undefined1 local_59;
  ulong local_58;
  long *local_50;
  sbuffer local_48;
  
  plVar3 = u_1;
  local_50 = u_3;
  msgpack::v1::sbuffer::sbuffer(&local_48,0x2000);
  local_59 = 0x94;
  local_68.m_stream = &local_48;
  msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x1,(size_t)plVar3);
  local_59 = 0;
  msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x1,(size_t)plVar3);
  uVar1 = this->msgid_;
  __n = uVar1 + 1;
  this->msgid_ = __n;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_59 = (char)uVar1;
      msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x1,__n);
    }
    else {
      local_59 = 0xcc;
      local_58 = CONCAT71(local_58._1_7_,(char)uVar1);
      msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x2,__n);
    }
  }
  else if (uVar1 < 0x10000) {
    local_59 = 0xcd;
    local_58 = CONCAT62(local_58._2_6_,(ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
    msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x3,__n);
  }
  else {
    __n = uVar1 >> 0x20;
    if (__n == 0) {
      local_59 = 0xce;
      uVar2 = (uint)uVar1;
      local_58 = CONCAT44(local_58._4_4_,
                          uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
      msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x5,0);
    }
    else {
      local_59 = 0xcf;
      local_58 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
      msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x9,__n);
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_59,&local_68,method);
  local_59 = 0x96;
  msgpack::v1::sbuffer::write(local_68.m_stream,(int)&local_59,(void *)0x1,__n);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>(&local_68,*u);
  plVar3 = local_50;
  detail::pack<long,std::__cxx11::string,long,long,long>(&local_68,u_1,u_2,local_50,u_4,u_5);
  Socket::write(&this->socket_,(int)local_48.m_data,(void *)local_48.m_size,(size_t)plVar3);
  free(local_48.m_data);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}